

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu.c
# Opt level: O0

int gpu_default_print(GPU_LogLevelEnum log_level,char *format,__va_list_tag *args)

{
  GPU_DebugLevelEnum GVar1;
  undefined8 local_38;
  undefined8 local_30;
  __va_list_tag *args_local;
  char *format_local;
  GPU_LogLevelEnum log_level_local;
  
  if (log_level == GPU_LOG_INFO) {
    GVar1 = GPU_GetDebugLevel();
    if (GVar1 < GPU_DEBUG_LEVEL_3) {
      local_30 = _stdout;
    }
    else {
      local_30 = _stderr;
    }
    format_local._4_4_ = vfprintf(local_30,format,args);
  }
  else if (log_level == GPU_LOG_WARNING) {
    GVar1 = GPU_GetDebugLevel();
    if (GVar1 < GPU_DEBUG_LEVEL_2) {
      local_38 = _stdout;
    }
    else {
      local_38 = _stderr;
    }
    format_local._4_4_ = vfprintf(local_38,format,args);
  }
  else if (log_level == GPU_LOG_ERROR) {
    format_local._4_4_ = vfprintf(_stderr,format,args);
  }
  else {
    format_local._4_4_ = 0;
  }
  return format_local._4_4_;
}

Assistant:

int gpu_default_print(GPU_LogLevelEnum log_level, const char* format, va_list args)
{
    switch(log_level)
    {
#ifdef __ANDROID__
    case GPU_LOG_INFO:
        return __android_log_vprint((GPU_GetDebugLevel() >= GPU_DEBUG_LEVEL_3? ANDROID_LOG_ERROR : ANDROID_LOG_INFO), "APPLICATION", format, args);
    case GPU_LOG_WARNING:
        return __android_log_vprint((GPU_GetDebugLevel() >= GPU_DEBUG_LEVEL_2? ANDROID_LOG_ERROR : ANDROID_LOG_WARN), "APPLICATION", format, args);
    case GPU_LOG_ERROR:
        return __android_log_vprint(ANDROID_LOG_ERROR, "APPLICATION", format, args);
#else
    case GPU_LOG_INFO:
        return vfprintf((GPU_GetDebugLevel() >= GPU_DEBUG_LEVEL_3? stderr : stdout), format, args);
    case GPU_LOG_WARNING:
        return vfprintf((GPU_GetDebugLevel() >= GPU_DEBUG_LEVEL_2? stderr : stdout), format, args);
    case GPU_LOG_ERROR:
        return vfprintf(stderr, format, args);
#endif
    default:
        return 0;
    }
}